

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QDnsMailExchangeRecord __thiscall
QList<QDnsMailExchangeRecord>::takeAt(QList<QDnsMailExchangeRecord> *this,qsizetype i)

{
  char *in_RDX;
  QList<QDnsMailExchangeRecord> *in_RSI;
  QSharedDataPointer<QDnsMailExchangeRecordPrivate> in_RDI;
  QDnsMailExchangeRecord *t;
  QDnsMailExchangeRecordPrivate *this_00;
  
  *(undefined8 *)&((QDnsMailExchangeRecordPrivate *)in_RDI.d.ptr)->super_QDnsRecordPrivate =
       0xaaaaaaaaaaaaaaaa;
  this_00 = (QDnsMailExchangeRecordPrivate *)in_RDI.d.ptr;
  operator[]((QList<QDnsMailExchangeRecord> *)in_RDI.d.ptr,(qsizetype)in_RDI.d.ptr);
  QDnsMailExchangeRecord::QDnsMailExchangeRecord
            ((QDnsMailExchangeRecord *)this_00,(QDnsMailExchangeRecord *)in_RDI.d.ptr);
  remove(in_RSI,in_RDX);
  return (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)
         (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)in_RDI.d.ptr;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }